

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::FIFloatDecoder::~FIFloatDecoder(FIFloatDecoder *this)

{
  FIFloatDecoder *this_local;
  
  ~FIFloatDecoder(this);
  operator_delete(this,8);
  return;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 3) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<float> value;
        size_t numFloats = len / 4;
        value.reserve(numFloats);
        for (size_t i = 0; i < numFloats; ++i) {
            int v = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
            float f;
            memcpy(&f, &v, 4);
            value.push_back(f);
            data += 4;
        }
        return FIFloatValue::create(std::move(value));
    }